

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int check_command(GlobalVars *gv,char *name,uint32_t flags)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint in_EDX;
  char *in_RSI;
  GlobalVars *in_RDI;
  ScriptCmd *scptr;
  ScriptCmd *local_28;
  int local_4;
  
  local_28 = ldCommands;
  while ((local_28->name != (char *)0x0 && (iVar2 = strcmp(local_28->name,in_RSI), iVar2 != 0))) {
    local_28 = local_28 + 1;
  }
  pcVar1 = scriptname;
  if (local_28->name == (char *)0x0) {
    local_4 = 0;
  }
  else {
    if ((local_28->flags & in_EDX) == 0) {
      if ((in_EDX & 0x8000) == 0) {
        uVar3 = getlineno();
        error(0x6b,pcVar1,(ulong)uVar3,in_RSI);
      }
      if ((local_28->flags & 0x2000) != 0) {
        skipblock(0,'\0','\x11');
      }
      if ((local_28->flags & 0x4000) != 0) {
        skip_expr(0);
      }
    }
    else if (local_28->cmdptr == (_func_void_GlobalVars_ptr *)0x0) {
      uVar3 = getlineno();
      error(0x45,pcVar1,(ulong)uVar3,in_RSI);
      if ((local_28->flags & 0x2000) != 0) {
        skipblock(0,'\0','\x11');
      }
    }
    else {
      (*local_28->cmdptr)(in_RDI);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int check_command(struct GlobalVars *gv,char *name,uint32_t flags)
{
  struct ScriptCmd *scptr;

  for (scptr=ldCommands; scptr->name; scptr++) {
    if (!strcmp(scptr->name,name))
      break;
  }

  if (scptr->name) {
    if (scptr->flags & flags) {
      if (scptr->cmdptr) {
        scptr->cmdptr(gv);  /* execute linker-script command */
      }
      else {
        error(69,scriptname,getlineno(),name);  /* command ignored */
        if (scptr->flags & SCMDF_PAREN)
          skipblock(0,'(',')');
      }
    }
    else {
      if (!(flags & SCMDF_IGNORE)) {
        /* command not allowed outside SECTIONS block */
        error(107,scriptname,getlineno(),name);
      }
      if (scptr->flags & SCMDF_PAREN)
        skipblock(0,'(',')');
      if (scptr->flags & SCMDF_SEMIC)
        skip_expr(0);
    }
    return 1;
  }

  return 0;
}